

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemove.cc
# Opt level: O3

void board::makemove::undo(Board *pos)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  pointer pUVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  
  pos->ply = pos->ply + -1;
  pUVar5 = (pos->history).super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar1 = pUVar5[-1].castlePerm;
  iVar2 = pUVar5[-1].enPas;
  iVar3 = pUVar5[-1].fiftyMove;
  uVar4 = pUVar5[-1].moveValue;
  (pos->history).super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
  super__Vector_impl_data._M_finish = pUVar5 + -1;
  pos->fiftyMove = iVar3;
  if ((long)pos->enPas != 99) {
    pos->hashKey = pos->hashKey ^ Board::PIECE_KEYS[0][pos->enPas];
  }
  uVar13 = uVar4 & 0x7f;
  uVar14 = uVar4 >> 7 & 0x7f;
  pos->enPas = iVar2;
  if (iVar2 == 99) {
    uVar8 = pos->hashKey;
  }
  else {
    uVar8 = pos->hashKey ^ Board::PIECE_KEYS[0][iVar2];
    pos->hashKey = uVar8;
  }
  uVar6 = Board::CASTLE_KEYS[pos->castlePerm];
  pos->hashKey = uVar8 ^ uVar6;
  pos->castlePerm = iVar1;
  uVar7 = Board::CASTLE_KEYS[iVar1];
  uVar15 = pos->side;
  pos->side = uVar15 ^ 1;
  uVar8 = uVar7 ^ Board::SIDE_KEY ^ uVar8 ^ uVar6;
  pos->hashKey = uVar8;
  if ((uVar4 >> 0x12 & 1) == 0) {
    if ((uVar4 >> 0x18 & 1) != 0) {
      if (uVar14 < 0x5d) {
        if (uVar14 == 0x17) {
          iVar1 = pos->board[0x18];
          iVar2 = Board::PIECE_COLOR[iVar1];
          uVar8 = uVar8 ^ Board::PIECE_KEYS[iVar1][0x15];
          pos->hashKey = uVar8;
          pos->hashKey = uVar8 ^ Board::PIECE_KEYS[iVar1][0x18];
          pos->board[0x18] = 0;
          pos->board[0x15] = iVar1;
          if (Board::PIECE_NO_TEAM[iVar1] == 1) {
            bitboard::clearBit(pos->pawns + iVar2,3);
            bitboard::clearBit(pos->pawns + 2,3);
            bitboard::setBit(pos->pawns + iVar2,0);
            bitboard::setBit(pos->pawns + 2,0);
          }
          if (0 < (long)pos->pNum[iVar1]) {
            lVar10 = 0;
            do {
              if (pos->pList[iVar1][lVar10] == 0x18) {
                pos->pList[iVar1][lVar10] = 0x15;
                break;
              }
              lVar10 = lVar10 + 1;
            } while (pos->pNum[iVar1] != lVar10);
          }
        }
        else if (uVar14 == 0x1b) {
          iVar1 = pos->board[0x1a];
          iVar2 = Board::PIECE_COLOR[iVar1];
          uVar8 = uVar8 ^ Board::PIECE_KEYS[iVar1][0x1c];
          pos->hashKey = uVar8;
          pos->hashKey = uVar8 ^ Board::PIECE_KEYS[iVar1][0x1a];
          pos->board[0x1a] = 0;
          pos->board[0x1c] = iVar1;
          if (Board::PIECE_NO_TEAM[iVar1] == 1) {
            bitboard::clearBit(pos->pawns + iVar2,5);
            bitboard::clearBit(pos->pawns + 2,5);
            bitboard::setBit(pos->pawns + iVar2,7);
            bitboard::setBit(pos->pawns + 2,7);
          }
          if (0 < (long)pos->pNum[iVar1]) {
            lVar10 = 0;
            do {
              if (pos->pList[iVar1][lVar10] == 0x1a) {
                pos->pList[iVar1][lVar10] = 0x1c;
                break;
              }
              lVar10 = lVar10 + 1;
            } while (pos->pNum[iVar1] != lVar10);
          }
        }
      }
      else if (uVar14 == 0x5d) {
        iVar1 = pos->board[0x5e];
        iVar2 = Board::PIECE_COLOR[iVar1];
        uVar8 = uVar8 ^ Board::PIECE_KEYS[iVar1][0x5b];
        pos->hashKey = uVar8;
        pos->hashKey = uVar8 ^ Board::PIECE_KEYS[iVar1][0x5e];
        pos->board[0x5e] = 0;
        pos->board[0x5b] = iVar1;
        if (Board::PIECE_NO_TEAM[iVar1] == 1) {
          bitboard::clearBit(pos->pawns + iVar2,0x3b);
          bitboard::clearBit(pos->pawns + 2,0x3b);
          bitboard::setBit(pos->pawns + iVar2,0x38);
          bitboard::setBit(pos->pawns + 2,0x38);
        }
        if (0 < (long)pos->pNum[iVar1]) {
          lVar10 = 0;
          do {
            if (pos->pList[iVar1][lVar10] == 0x5e) {
              pos->pList[iVar1][lVar10] = 0x5b;
              break;
            }
            lVar10 = lVar10 + 1;
          } while (pos->pNum[iVar1] != lVar10);
        }
      }
      else if (uVar14 == 0x61) {
        iVar1 = pos->board[0x60];
        iVar2 = Board::PIECE_COLOR[iVar1];
        uVar8 = uVar8 ^ Board::PIECE_KEYS[iVar1][0x62];
        pos->hashKey = uVar8;
        pos->hashKey = uVar8 ^ Board::PIECE_KEYS[iVar1][0x60];
        pos->board[0x60] = 0;
        pos->board[0x62] = iVar1;
        if (Board::PIECE_NO_TEAM[iVar1] == 1) {
          bitboard::clearBit(pos->pawns + iVar2,0x3d);
          bitboard::clearBit(pos->pawns + 2,0x3d);
          bitboard::setBit(pos->pawns + iVar2,0x3f);
          bitboard::setBit(pos->pawns + 2,0x3f);
        }
        if (0 < (long)pos->pNum[iVar1]) {
          lVar10 = 0;
          do {
            if (pos->pList[iVar1][lVar10] == 0x60) {
              pos->pList[iVar1][lVar10] = 0x62;
              break;
            }
            lVar10 = lVar10 + 1;
          } while (pos->pNum[iVar1] != lVar10);
        }
      }
    }
  }
  else if (uVar15 == 1) {
    pos->material[1] = pos->material[1] + 100;
    pos->board[(ulong)uVar14 - 10] = 7;
    pos->hashKey = uVar8 ^ Board::PIECE_KEYS[6][(ulong)uVar14 + 0x6e];
    iVar1 = Board::SQ64[(ulong)uVar14 - 10];
    bitboard::setBit(pos->pawns + 1,iVar1);
    bitboard::setBit(pos->pawns + 2,iVar1);
    pos->pList[7][pos->pNum[7]] = uVar14 - 10;
    pos->pNum[7] = pos->pNum[7] + 1;
  }
  else {
    uVar15 = uVar14 + 10;
    pos->material[0] = pos->material[0] + 100;
    pos->board[uVar15] = 1;
    pos->hashKey = uVar8 ^ Board::PIECE_KEYS[1][uVar15];
    iVar1 = Board::SQ64[(ulong)uVar14 + 10];
    bitboard::setBit(pos->pawns,iVar1);
    bitboard::setBit(pos->pawns + 2,iVar1);
    pos->pList[1][pos->pNum[1]] = uVar15;
    pos->pNum[1] = pos->pNum[1] + 1;
  }
  iVar1 = pos->board[uVar14];
  iVar2 = Board::PIECE_COLOR[iVar1];
  uVar8 = pos->hashKey ^ Board::PIECE_KEYS[iVar1][uVar13];
  pos->hashKey = uVar8;
  pos->hashKey = uVar8 ^ Board::PIECE_KEYS[iVar1][uVar14];
  pos->board[uVar14] = 0;
  pos->board[uVar13] = iVar1;
  if (Board::PIECE_NO_TEAM[iVar1] == 1) {
    iVar3 = Board::SQ64[uVar14];
    bitboard::clearBit(pos->pawns + iVar2,iVar3);
    bitboard::clearBit(pos->pawns + 2,iVar3);
    iVar3 = Board::SQ64[uVar13];
    bitboard::setBit(pos->pawns + iVar2,iVar3);
    bitboard::setBit(pos->pawns + 2,iVar3);
  }
  uVar15 = uVar4 >> 0xe & 0xf;
  if (0 < (long)pos->pNum[iVar1]) {
    lVar10 = 0;
    do {
      if (pos->pList[iVar1][lVar10] == uVar14) {
        pos->pList[iVar1][lVar10] = uVar13;
        break;
      }
      lVar10 = lVar10 + 1;
    } while (pos->pNum[iVar1] != lVar10);
  }
  if ((uVar4 >> 0xe & 0xf) != 0) {
    uVar8 = (ulong)(uVar15 * 4);
    iVar1 = *(int *)((long)Board::PIECE_COLOR + uVar8);
    pos->material[iVar1] = pos->material[iVar1] + *(int *)((long)Board::PIECE_VAL + uVar8);
    pos->board[uVar14] = uVar15;
    pos->hashKey = pos->hashKey ^ Board::PIECE_KEYS[uVar15][uVar14];
    if (*(int *)((long)Board::PIECE_NO_TEAM + uVar8) == 1) {
      iVar2 = Board::SQ64[uVar14];
      bitboard::setBit(pos->pawns + iVar1,iVar2);
      bitboard::setBit(pos->pawns + 2,iVar2);
    }
    pos->pList[uVar15][pos->pNum[uVar15]] = uVar14;
    pos->pNum[uVar15] = pos->pNum[uVar15] + 1;
  }
  if ((uVar4 >> 0x14 & 0xf) != 0) {
    lVar10 = (long)pos->board[uVar13];
    iVar1 = Board::PIECE_COLOR[lVar10];
    pos->material[iVar1] = pos->material[iVar1] - Board::PIECE_VAL[lVar10];
    pos->hashKey = pos->hashKey ^ Board::PIECE_KEYS[lVar10][uVar13];
    pos->board[uVar13] = 0;
    if (Board::PIECE_NO_TEAM[lVar10] == 1) {
      iVar2 = Board::SQ64[uVar13];
      bitboard::clearBit(pos->pawns + iVar1,iVar2);
      bitboard::clearBit(pos->pawns + 2,iVar2);
    }
    lVar9 = (long)pos->pNum[lVar10];
    lVar11 = -1;
    if (0 < lVar9) {
      lVar12 = 0;
      do {
        lVar11 = lVar12;
        if (pos->pList[lVar10][lVar12] == uVar13) break;
        lVar12 = lVar12 + 1;
        lVar11 = -1;
      } while (lVar9 != lVar12);
    }
    pos->pNum[lVar10] = pos->pNum[lVar10] + -1;
    pos->pList[lVar10][lVar11] = pos->pList[lVar10 + -1][lVar9 + 9];
    lVar10 = 7;
    if (Board::PIECE_COLOR[uVar4 >> 0x14 & 0xf] == 0) {
      lVar10 = 1;
    }
    uVar8 = (ulong)(uint)((int)lVar10 * 4);
    iVar1 = *(int *)((long)Board::PIECE_COLOR + uVar8);
    pos->material[iVar1] = pos->material[iVar1] + *(int *)((long)Board::PIECE_VAL + uVar8);
    pos->board[uVar13] = (int)lVar10;
    pos->hashKey = pos->hashKey ^ Board::PIECE_KEYS[lVar10][uVar13];
    if (*(int *)((long)Board::PIECE_NO_TEAM + uVar8) == 1) {
      iVar2 = Board::SQ64[uVar13];
      bitboard::setBit(pos->pawns + iVar1,iVar2);
      bitboard::setBit(pos->pawns + 2,iVar2);
    }
    pos->pList[lVar10][pos->pNum[lVar10]] = uVar13;
    pos->pNum[lVar10] = pos->pNum[lVar10] + 1;
  }
  return;
}

Assistant:

void board::makemove::undo(Board& pos)
{
    pos.decrementPly();
    Undo undo = pos.popHistory();
    int move = undo.getMoveValue();
    int from = Move::FROMSQ(move);
    int to = Move::TOSQ(move);
    int captured = Move::CAPTURED(move);
    int promoted = Move::PROMOTED(move);
    pos.setFiftyMove(undo.getFiftyMove());
    if (pos.getEnPas() != NO_SQ) {
        pos.hashEnPas();
    }
    pos.setEnPas(undo.getEnPas());
    if (pos.getEnPas() != NO_SQ) {
        pos.hashEnPas();
    }
    pos.hashCastle();
    pos.setCastlePerm(undo.getCastlePerm());
    pos.hashCastle();
    pos.updateSide();
    pos.hashSide();
    if (Move::MFLAGEP & move) {
        if (pos.getSide() == WHITE) {
            addPiece(BP, to - 10, pos);
        }
        else {
            addPiece(WP, to + 10, pos);
        }
    }
    else if (Move::MFLAGCA & move) {
        if (to == C1) {
            movePiece(D1, A1, pos);
        }
        else if (to == C8) {
            movePiece(D8, A8, pos);
        }
        else if (to == G1) {
            movePiece(F1, H1, pos);
        }
        else if (to == G8) {
            movePiece(F8, H8, pos);
        }
    }
    movePiece(to, from, pos);
    if (captured != EMPTY) {
        addPiece(captured, to, pos);
    }
    if (promoted != EMPTY) {
        clearPiece(from, pos);
        addPiece(Board::PIECE_COLOR[promoted] == WHITE ? WP : BP, from, pos);
    }
}